

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

RunnerContext * RunFuncWithArgs(Runner *runner,ASTNode *func,ASTList *args)

{
  RunnerContext *pRVar1;
  RunnerContext *context;
  ASTNode *param;
  ASTListItem *item_1;
  RunnerContext *context_1;
  int paramIdx;
  ASTNode *arg;
  ASTListItem *item;
  int argIdx;
  ASTList *args_local;
  ASTNode *func_local;
  Runner *runner_local;
  
  item._4_4_ = 0;
  arg = (ASTNode *)args->first;
  do {
    if (arg == (ASTNode *)0x0) {
      pRVar1 = Run(runner,(func->meta).funcExpr.body);
      GCScope(runner,(func->meta).funcExpr.body);
      GCAstList(runner,(func->meta).funcExpr.params);
      return pRVar1;
    }
    context_1._4_4_ = 0;
    pRVar1 = SetNodeValue(runner,*(ASTNode **)arg);
    for (param = (ASTNode *)((func->meta).funcExpr.params)->first; param != (ASTNode *)0x0;
        param = *(ASTNode **)&param->isStmt) {
      if (item._4_4_ == context_1._4_4_) {
        pRVar1->node = *(ASTNode **)param;
        break;
      }
      context_1._4_4_ = context_1._4_4_ + 1;
    }
    item._4_4_ = item._4_4_ + 1;
    arg = *(ASTNode **)&arg->isStmt;
  } while( true );
}

Assistant:

RunnerContext* RunFuncWithArgs(Runner* runner, ASTNode* func, ASTList* args){
  DEBUG_PRINT_RUNNER("Function Scope")

  int argIdx = 0;
  FOREACH_AST(args){
    ASTNode* arg = item->node;
    int paramIdx = 0;
    RunnerContext* context = SetNodeValue(runner, arg);

    FOREACH_AST(GET_FUNC_PARAMS(func)){
      if (argIdx == paramIdx++){
        ASTNode* param = item->node;
        context->node = param;
        break;
      }
    }

    argIdx++;
  }

  RunnerContext* context = Run(runner, GET_FUNC_BODY(func));
  GCScope(runner, GET_FUNC_BODY(func));
  GCAstList(runner, GET_FUNC_PARAMS(func));
  return context;
}